

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fseek.c
# Opt level: O0

int fseek(FILE *__stream,long __off,int __whence)

{
  int iVar1;
  long lVar2;
  int rc;
  int whence_local;
  long offset_local;
  _PDCLIB_file_t *stream_local;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  if ((((ulong)__stream->_IO_buf_end & 0x1000000000) == 0) ||
     (iVar1 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream), iVar1 != -1)) {
    *(uint *)((long)&__stream->_IO_buf_end + 4) =
         *(uint *)((long)&__stream->_IO_buf_end + 4) & 0xfffffbff;
    if (((ulong)__stream->_IO_buf_end & 0x4000000000) != 0) {
      *(uint *)((long)&__stream->_IO_buf_end + 4) =
           *(uint *)((long)&__stream->_IO_buf_end + 4) & 0xffffffe7;
    }
    _rc = __off;
    if (__whence == 1) {
      _rc = __off - (long)(__stream->_IO_buf_base +
                          ((int)__stream->_IO_write_base - (int)__stream->_IO_read_base));
    }
    lVar2 = _PDCLIB_seek((_PDCLIB_file_t *)__stream,_rc,__whence);
    stream_local._4_4_ = -1;
    if (lVar2 != -1) {
      stream_local._4_4_ = 0;
    }
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  }
  else {
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    stream_local._4_4_ = -1;
  }
  return stream_local._4_4_;
}

Assistant:

int fseek( struct _PDCLIB_file_t * stream, long offset, int whence )
{
    int rc;
    _PDCLIB_LOCK( stream->mtx );

    if ( stream->status & _PDCLIB_FWRITE )
    {
        if ( _PDCLIB_flushbuffer( stream ) == EOF )
        {
            _PDCLIB_UNLOCK( stream->mtx );
            return EOF;
        }
    }

    stream->status &= ~ _PDCLIB_EOFFLAG;

    if ( stream->status & _PDCLIB_FRW )
    {
        stream->status &= ~( _PDCLIB_FREAD | _PDCLIB_FWRITE );
    }

    if ( whence == SEEK_CUR )
    {
        offset -= ( ( ( int )stream->bufend - ( int )stream->bufidx ) + stream->ungetidx );
    }

    rc = ( _PDCLIB_seek( stream, offset, whence ) != EOF ) ? 0 : EOF;
    _PDCLIB_UNLOCK( stream->mtx );
    return rc;
}